

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  long *plVar6;
  int iVar7;
  int iVar8;
  int local_6c;
  size_type *psStack_68;
  int E;
  string turn;
  int local_40;
  int LX;
  int LY;
  int local_34;
  int TX;
  int TY;
  
  piVar4 = (istream *)
           std::istream::operator>>((istream *)&std::cin,(int *)(turn.field_2._M_local_buf + 0xc));
  piVar4 = (istream *)std::istream::operator>>(piVar4,&local_40);
  piVar4 = (istream *)std::istream::operator>>(piVar4,&LY);
  std::istream::operator>>(piVar4,&local_34);
  std::istream::ignore();
  do {
    std::istream::operator>>((istream *)&std::cin,&local_6c);
    std::istream::ignore();
    iVar2 = local_34;
    iVar3 = LY;
    uVar1 = turn.field_2._12_4_;
    LX = local_40;
    iVar8 = local_40 - local_34;
    psStack_68 = &turn._M_string_length;
    turn._M_dataplus._M_p = (pointer)0x0;
    turn._M_string_length._0_1_ = 0;
    if ((iVar8 < 0) || (iVar8 != 0)) {
      std::__cxx11::string::append((char *)&stack0xffffffffffffff98);
    }
    iVar7 = uVar1 - iVar3;
    if ((0 < iVar7) || (iVar7 < 0)) {
      std::__cxx11::string::append((char *)&stack0xffffffffffffff98);
    }
    iVar3 = -(uint)(uVar1 != iVar3);
    if (0 < iVar7) {
      iVar3 = 1;
    }
    LY = LY + iVar3;
    iVar3 = -(uint)(LX != iVar2);
    if (0 < iVar8) {
      iVar3 = 1;
    }
    local_34 = local_34 + iVar3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"dx = ",5);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", dy =",6);
    plVar6 = (long *)std::ostream::operator<<(poVar5,iVar8);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)psStack_68,(long)turn._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (psStack_68 != &turn._M_string_length) {
      operator_delete(psStack_68,
                      CONCAT71(turn._M_string_length._1_7_,(undefined1)turn._M_string_length) + 1);
    }
  } while( true );
}

Assistant:

int main()
{
    int LX; // the X position of the light of power
    int LY; // the Y position of the light of power
    int TX; // Thor's starting X position
    int TY; // Thor's starting Y position
    cin >> LX >> LY >> TX >> TY; cin.ignore();

    // game loop
    while (1)
    {
        int E; // The level of Thor's remaining energy, representing the number of moves he can still make.
        cin >> E;
        cin.ignore();

        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;
        int dx = LX - TX;
        int dy = LY - TY;
        std::string turn;
        if (0 > dy)
        {
            turn += "N";
        } else if (0 < dy)
        {
            turn += "S";
        }
        if (0 < dx)
        {
            turn += "E";
        } else if (0 > dx)
        {
            turn += "W";
        }
        TX += sign(dx);
        TY += sign(dy);
        std::cerr << "dx = " << dx << ", dy =" << dy << std::endl;

        cout << turn << endl; // A single line providing the move to be made: N NE E SE S SW W or NW
    }
}